

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_overlay.cpp
# Opt level: O2

array<unsigned_long,_2UL> __thiscall Omega_h::Overlay::get_face_cells(Overlay *this,size_t face)

{
  int iVar1;
  size_t i_1;
  ulong uVar2;
  ulong uVar3;
  array<unsigned_long,_2UL> cells;
  Adj faces2cells;
  
  Omega_h::Mesh::get_adj(&faces2cells,&this->mesh,2,3);
  iVar1 = *(int *)((long)faces2cells.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                  ((long)(face << 0x20) >> 0x1e));
  uVar2 = (long)*(int *)((long)faces2cells.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                        ((long)((face << 0x20) + 0x100000000) >> 0x1e)) - (long)iVar1;
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    cells._M_elems[uVar3] =
         (long)*(int *)((long)faces2cells.super_Graph.ab2b.write_.shared_alloc_.direct_ptr +
                       (long)(iVar1 + (int)uVar3) * 4);
  }
  for (; uVar2 < 2; uVar2 = uVar2 + 1) {
    cells._M_elems[uVar2] = 0xffffffffffffffff;
  }
  Adj::~Adj(&faces2cells);
  return (array<unsigned_long,_2UL>)cells._M_elems;
}

Assistant:

std::array<size_t, 2> Overlay::get_face_cells(size_t face) const {
  std::array<size_t, 2> cells;
  auto faces2cells = mesh.get_adj(FACE, REGION);
  auto face_i = LO(face);
  auto begin_i = size_t(faces2cells.a2ab[face_i]);
  auto ncells = size_t(faces2cells.a2ab[face_i + 1]) - begin_i;
  for (size_t i = 0; i < ncells; ++i) {
    cells[i] = size_t(faces2cells.ab2b[LO(begin_i + i)]);
  }
  for (size_t i = ncells; i < 2; ++i) {
    cells[i] = get_invalid_cell_handle();
  }
  return cells;
}